

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void nop_Ev(PDISASM pMyDisasm)

{
  int iVar1;
  uint uVar2;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Instruction).Category = 0x1000c;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"nop",4);
  iVar1 = (pMyDisasm->Reserved_).OperandSize;
  uVar2 = 0x68;
  if (iVar1 != 0x40) {
    uVar2 = iVar1 == 0x20 | 0x66;
  }
  (pMyDisasm->Reserved_).MemDecoration = uVar2;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand1).AccessMode = 1;
  return;
}

Assistant:

void __bea_callspec__ nop_Ev(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+MISCELLANEOUS_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "nop");
  #endif
  if (GV.OperandSize == 64) {
      GV.MemDecoration = Arg2qword;
  }
  else if (GV.OperandSize == 32) {
      GV.MemDecoration = Arg2dword;
  }
  else {
      GV.MemDecoration = Arg2word;
  }
  decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
  pMyDisasm->Operand2.AccessMode = 0;
  pMyDisasm->Operand1.AccessMode = READ;
}